

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

get_result * __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
          (get_result *__return_storage_ptr__,
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          art_key_type k)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aVar5;
  ulong uVar6;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 shifted_key_u64;
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_00;
  uintptr_t uVar7;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *this_01;
  find_result fVar8;
  
  uVar7 = (this->root).tagged_ptr;
  if (uVar7 != 0) {
    bVar1 = (__return_storage_ptr__->
            super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
            _M_payload.
            super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
            _M_engaged;
    aVar5 = k.field_0;
    shifted_key_u64 = k.field_0;
    while ((uVar7 & 7) != 0) {
      this_00 = (basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *)(uVar7 & 0xfffffffffffffff8);
      bVar2 = *(byte *)((long)&this_00->k_prefix + 7);
      if (7 < bVar2) {
        (__return_storage_ptr__->
        super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
        _M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>
        ._M_engaged = bVar1;
        __assert_fail("result <= key_prefix_capacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                      ,0x298,
                      "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<unsigned long>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<unsigned long>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::critical_section_policy]"
                     );
      }
      uVar3 = detail::
              key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
              ::get_shared_length((key_prefix<unodb::detail::basic_art_key<unsigned_long>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
                                   *)this_00,shifted_key_u64.key);
      if (uVar3 < bVar2) goto LAB_00205197;
      uVar6 = shifted_key_u64.key >> ((bVar2 & 7) << 3);
      fVar8 = detail::
              basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              ::find_child(this_00,(node_type)uVar7 & (I256|I48),(byte)uVar6);
      aVar5.key = (unsigned_long)fVar8.second;
      if ((undefined8 *)aVar5.key == (undefined8 *)0x0) {
        (__return_storage_ptr__->
        super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
        _M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>
        ._M_engaged = false;
        return __return_storage_ptr__;
      }
      shifted_key_u64.key = uVar6 >> 8;
      uVar7 = *(uintptr_t *)aVar5;
    }
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>)._M_payload
    .super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._M_engaged =
         bVar1;
    this_01 = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)(uVar7 & 0xfffffffffffffff8);
    iVar4 = detail::basic_leaf<unsigned_long,_unodb::detail::node_header>::cmp
                      (this_01,(void *)k.field_0,(void *)aVar5);
    if (iVar4 == 0) {
      uVar3 = this_01->value_size;
      (__return_storage_ptr__->
      super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
      _M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
      _M_payload._M_value._M_ptr = this_01->data + this_01->key_size;
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>
                        )._M_payload.
                        super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>
                        ._M_payload + 8) = (ulong)uVar3;
      (__return_storage_ptr__->
      super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>).
      _M_payload.super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>.
      _M_engaged = true;
      return __return_storage_ptr__;
    }
  }
LAB_00205197:
  (__return_storage_ptr__->
  super__Optional_base<std::span<const_std::byte,_18446744073709551615UL>,_true,_true>)._M_payload.
  super__Optional_payload_base<std::span<const_std::byte,_18446744073709551615UL>_>._M_engaged =
       false;
  return __return_storage_ptr__;
}

Assistant:

typename db<Key, Value>::get_result db<Key, Value>::get_internal(
    art_key_type k) const noexcept {
  if (UNODB_DETAIL_UNLIKELY(root == nullptr)) return {};

  auto node{root};
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (leaf->matches(k)) return leaf->get_value_view();
      return {};
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    if (key_prefix.get_shared_length(remaining_key) < key_prefix_length)
      return {};
    remaining_key.shift_right(key_prefix_length);
    const auto* const child{
        inode->find_child(node_type, remaining_key[0]).second};
    if (child == nullptr) return {};

    node = *child;
    remaining_key.shift_right(1);
  }
}